

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_3dfloors.cpp
# Opt level: O2

bool P_CheckFor3DFloorHit(AActor *mo,double z)

{
  uint uVar1;
  extsector_t *peVar2;
  F3DFloor **ppFVar3;
  long lVar4;
  ASectorAction *pAVar5;
  long lVar6;
  double dVar7;
  
  if ((mo->player == (player_t *)0x0) || ((mo->player->cheats & 0x2000) == 0)) {
    peVar2 = mo->Sector->e;
    ppFVar3 = (peVar2->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Array;
    uVar1 = (peVar2->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count;
    for (lVar6 = 0; (ulong)uVar1 << 3 != lVar6; lVar6 = lVar6 + 8) {
      lVar4 = *(long *)((long)ppFVar3 + lVar6);
      if ((((~*(uint *)(lVar4 + 0x58) & 3) == 0) &&
          (pAVar5 = GC::ReadBarrier<ASectorAction>
                              ((ASectorAction **)(*(long *)(lVar4 + 0x68) + 0x1f8)),
          pAVar5 != (ASectorAction *)0x0)) &&
         (dVar7 = secplane_t::ZatPoint(*(secplane_t **)(lVar4 + 0x28),mo),
         ABS(z - dVar7) < 1.52587890625e-05)) {
        pAVar5 = GC::ReadBarrier<ASectorAction>((ASectorAction **)(*(long *)(lVar4 + 0x68) + 0x1f8))
        ;
        ASectorAction::TriggerAction(pAVar5,mo,4);
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool P_CheckFor3DFloorHit(AActor * mo, double z)
{
	if ((mo->player && (mo->player->cheats & CF_PREDICTING))) return false;

	for (auto rover : mo->Sector->e->XFloor.ffloors)
	{
		if (!(rover->flags & FF_EXISTS)) continue;

		if(rover->flags & FF_SOLID && rover->model->SecActTarget)
		{
			if (fabs(z - rover->top.plane->ZatPoint(mo)) < EQUAL_EPSILON) 
			{
				rover->model->SecActTarget->TriggerAction (mo, SECSPAC_HitFloor);
				return true;
			}
		}
	}
	return false;
}